

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_enumerator.cpp
# Opt level: O1

EnumerationConstraint * __thiscall
Clasp::CBConsequences::doInit
          (CBConsequences *this,SharedContext *ctx,SharedMinimizeData *m,int param_3)

{
  byte bVar1;
  uint uVar2;
  Algo AVar3;
  pointer pPVar4;
  pointer pLVar5;
  pointer pVVar6;
  SharedConstraint *this_00;
  QueryFinder *this_01;
  State *pSVar7;
  int iVar8;
  ulong uVar9;
  Literal p;
  uint v;
  long lVar10;
  bool bVar11;
  
  (this->cons_).ebo_.size = 0;
  uVar9 = (ulong)(ctx->output).proj_.ebo_.size;
  iVar8 = (ctx->output).projMode_;
  bVar11 = uVar9 == 0;
  if (iVar8 != 0) {
    bVar11 = iVar8 == 1;
  }
  if (bVar11) {
    if ((ctx->output).facts_.ebo_.size != 0) {
      addLit(this,ctx,(Literal)0x0);
    }
    uVar9 = (ulong)(ctx->output).preds_.ebo_.size;
    if (uVar9 != 0) {
      pPVar4 = (ctx->output).preds_.ebo_.buf;
      lVar10 = 0;
      do {
        addLit(this,ctx,(Literal)*(uint32 *)((long)&(pPVar4->cond).rep_ + lVar10));
        lVar10 = lVar10 + 0x10;
      } while (uVar9 << 4 != lVar10);
    }
    uVar2 = (ctx->output).vars_.lo;
    iVar8 = (ctx->output).vars_.hi - uVar2;
    if (iVar8 != 0) {
      p.rep_ = uVar2 << 2;
      do {
        addLit(this,ctx,p);
        p.rep_ = p.rep_ + 4;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
  }
  else if (uVar9 != 0) {
    pLVar5 = (ctx->output).proj_.ebo_.buf;
    lVar10 = 0;
    do {
      addLit(this,ctx,(Literal)*(uint32 *)((long)&pLVar5->rep_ + lVar10));
      lVar10 = lVar10 + 4;
    } while (uVar9 << 2 != lVar10);
  }
  if (m != (SharedMinimizeData *)0x0) {
    if (m->optGen_ == 0) {
      bVar11 = m->mode_ == enumerate;
    }
    else {
      if (m->mode_ == enumerate) goto LAB_001826b0;
      bVar11 = (m->gCount_).super___atomic_base<unsigned_int>._M_i == m->optGen_;
    }
    if ((!bVar11) && (this->algo_ == Query)) {
      SharedContext::warn(ctx,"Query algorithm does not support optimization!");
      this->algo_ = Default;
    }
  }
LAB_001826b0:
  bVar11 = this->type_ == Cautious;
  AVar3 = this->algo_;
  uVar9 = (ulong)(this->cons_).ebo_.size;
  if (uVar9 != 0) {
    pLVar5 = (this->cons_).ebo_.buf;
    lVar10 = 0;
    do {
      uVar2 = *(uint *)((long)&pLVar5->rep_ + lVar10);
      *(uint *)((long)&pLVar5->rep_ + lVar10) = uVar2 | (AVar3 != Query && bVar11);
      v = uVar2 >> 2;
      pVVar6 = (ctx->varInfo_).ebo_.buf;
      bVar1 = pVVar6[v].rep;
      pVVar6[v].rep = bVar1 & 0xfc;
      if ((bVar1 & 0x20) == 0) {
        Solver::setPref(*(ctx->solvers_).ebo_.buf,v,def_value,
                        2U - ((uVar2 & 2) == 0) ^ bVar11 * '\x03');
      }
      lVar10 = lVar10 + 4;
    } while (uVar9 << 2 != lVar10);
  }
  this_00 = this->shared_;
  if (this_00 != (SharedConstraint *)0x0) {
    SharedConstraint::~SharedConstraint(this_00);
    operator_delete(this_00);
  }
  this->shared_ = (SharedConstraint *)0x0;
  Enumerator::setIgnoreSymmetric(&this->super_Enumerator,true);
  if ((this->type_ == Cautious) && (this->algo_ == Query)) {
    this_01 = (QueryFinder *)operator_new(0x60);
    QueryFinder::QueryFinder(this_01,&this->cons_,(ctx->varInfo_).ebo_.size);
  }
  else {
    pSVar7 = (State *)0x0;
    if (((uint)ctx->share_ & 0x3fe) != 0) {
      pSVar7 = (State *)operator_new(0x10);
      pSVar7->value_ = (ValueVec)0x0;
      LOCK();
      pSVar7->size_ = 0;
      UNLOCK();
    }
    this->shared_ = (SharedConstraint *)pSVar7;
    this_01 = (QueryFinder *)operator_new(0x70);
    EnumerationConstraint::EnumerationConstraint((EnumerationConstraint *)this_01);
    (this_01->super_EnumerationConstraint).super_Constraint._vptr_Constraint =
         (_func_int **)&PTR_propagate_001eb4d0;
    (this_01->open_).ebo_.buf = (pointer)0x0;
    (this_01->open_).ebo_.size = 0;
    (this_01->open_).ebo_.cap = 0;
    this_01->state_ = pSVar7;
    *(undefined8 *)&this_01->query_ = 0;
    this_01[1].super_EnumerationConstraint.super_Constraint._vptr_Constraint = (_func_int **)0x0;
    this_01[1].super_EnumerationConstraint.mini_ = (MinimizeConstraint *)0x0;
  }
  return &this_01->super_EnumerationConstraint;
}

Assistant:

EnumerationConstraint* CBConsequences::doInit(SharedContext& ctx, SharedMinimizeData* m, int) {
	cons_.clear();
	const OutputTable& out = ctx.output;
	if (out.projectMode() == ProjectMode_t::Output) {
		if (out.numFacts()) {
			addLit(ctx, lit_true());
		}
		for (OutputTable::pred_iterator it = out.pred_begin(), end = out.pred_end(); it != end; ++it) {
			addLit(ctx, it->cond);
		}
		for (OutputTable::range_iterator it = out.vars_begin(), end = out.vars_end(); it != end; ++it) {
			addLit(ctx, posLit(*it));
		}
	}
	else {
		for (OutputTable::lit_iterator it = out.proj_begin(), end = out.proj_end(); it != end; ++it) {
			addLit(ctx, *it);
		}
	}
	if (m && m->optimize() && algo_ == Query) {
		ctx.warn("Query algorithm does not support optimization!");
		algo_ = Default;
	}
	// init M to either cons or {} depending on whether we compute cautious or brave cons.
	const uint32 fMask = (type_ == Cautious && algo_ != Query);
	const uint32 vMask = (type_ == Cautious) ? 3u : 0u;
	for (LitVec::iterator it = cons_.begin(), end = cons_.end(); it != end; ++it) {
		it->rep() |= fMask;
		ctx.unmark(it->var());
		if (!ctx.varInfo(it->var()).nant()) {
			ctx.master()->setPref(it->var(), ValueSet::def_value, static_cast<ValueRep>(trueValue(*it) ^ vMask));
		}
	}
	delete shared_; shared_ = 0;
	setIgnoreSymmetric(true);
	if (type_ != Cautious || algo_ != Query) {
		shared_ = ctx.concurrency() > 1 ? new SharedConstraint() : 0;
		return new CBFinder(shared_);
	}
	return new QueryFinder(cons_, ctx.numVars() + 1);
}